

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int parse_path_key_expr(char *id,char **prefix,int *pref_len,char **name,int *nam_len,
                       int *parent_times)

{
  ushort *puVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x17c,
                  "int parse_path_key_expr(const char *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (parent_times == (int *)0x0) {
    __assert_fail("parent_times",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x17d,
                  "int parse_path_key_expr(const char *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (prefix != (char **)0x0) {
    *prefix = (char *)0x0;
  }
  if (pref_len != (int *)0x0) {
    *pref_len = 0;
  }
  if (name != (char **)0x0) {
    *name = (char *)0x0;
  }
  if (nam_len != (int *)0x0) {
    *nam_len = 0;
  }
  iVar4 = *parent_times;
  iVar6 = 0;
  if (iVar4 == 0) {
    iVar6 = strncmp(id,"current()",9);
    if (iVar6 != 0) {
      return 0;
    }
    pcVar8 = id + 9;
    ppuVar5 = __ctype_b_loc();
    puVar1 = *ppuVar5;
    cVar2 = id[9];
    if ((*(byte *)((long)puVar1 + (long)cVar2 * 2 + 1) & 0x20) == 0) {
      iVar6 = 9;
    }
    else {
      iVar6 = 9;
      do {
        iVar6 = iVar6 + 1;
        cVar2 = pcVar8[1];
        pcVar8 = pcVar8 + 1;
      } while ((*(byte *)((long)puVar1 + (long)cVar2 * 2 + 1) & 0x20) != 0);
    }
    if (cVar2 != '/') goto LAB_0011e169;
    id = pcVar8 + 2;
    do {
      iVar7 = iVar6;
      pcVar8 = id;
      iVar6 = iVar7 + 1;
      id = pcVar8 + 1;
    } while ((*(byte *)((long)puVar1 + (long)pcVar8[-1] * 2 + 1) & 0x20) != 0);
    iVar3 = strncmp(pcVar8 + -1,"..",2);
    if (iVar3 != 0) goto LAB_0011e169;
    iVar6 = iVar7 + 3;
    cVar2 = *id;
    iVar7 = 1;
    while ((*(byte *)((long)puVar1 + (long)cVar2 * 2 + 1) & 0x20) != 0) {
      iVar6 = iVar6 + 1;
      cVar2 = id[1];
      id = id + 1;
    }
  }
  else {
    iVar7 = 0;
  }
  if (*id == '/') {
    ppuVar5 = __ctype_b_loc();
    puVar1 = *ppuVar5;
    do {
      pcVar8 = id;
      iVar6 = iVar6 + 1;
      id = pcVar8 + 1;
    } while ((*(byte *)((long)puVar1 + (long)pcVar8[1] * 2 + 1) & 0x20) != 0);
    iVar3 = strncmp(id,"..",2);
    if (iVar3 == 0 && iVar4 == 0) {
      do {
        iVar6 = iVar6 + 2;
        cVar2 = pcVar8[3];
        id = pcVar8 + 3;
        while ((*(byte *)((long)puVar1 + (long)cVar2 * 2 + 1) & 0x20) != 0) {
          iVar6 = iVar6 + 1;
          cVar2 = id[1];
          id = id + 1;
        }
        if (cVar2 != '/') goto LAB_0011e169;
        iVar7 = iVar7 + 1;
        do {
          pcVar8 = id;
          iVar6 = iVar6 + 1;
          id = pcVar8 + 1;
        } while ((*(byte *)((long)puVar1 + (long)pcVar8[1] * 2 + 1) & 0x20) != 0);
        iVar3 = strncmp(id,"..",2);
      } while (iVar3 == 0);
    }
    if (iVar4 == 0) {
      *parent_times = iVar7;
    }
    iVar4 = parse_node_identifier(id,prefix,pref_len,name,nam_len);
    if (0 < iVar4) {
      return iVar6 + iVar4;
    }
    return iVar4 - iVar6;
  }
LAB_0011e169:
  return -iVar6;
}

Assistant:

static int
parse_path_key_expr(const char *id, const char **prefix, int *pref_len, const char **name, int *nam_len,
                    int *parent_times)
{
    int parsed = 0, ret, par_times = 0;

    assert(id);
    assert(parent_times);
    if (prefix) {
        *prefix = NULL;
    }
    if (pref_len) {
        *pref_len = 0;
    }
    if (name) {
        *name = NULL;
    }
    if (nam_len) {
        *nam_len = 0;
    }

    if (!*parent_times) {
        /* current-function-invocation *WSP "/" *WSP rel-path-keyexpr */
        if (strncmp(id, "current()", 9)) {
            return -parsed;
        }

        parsed += 9;
        id += 9;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        if (id[0] != '/') {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        /* rel-path-keyexpr */
        if (strncmp(id, "..", 2)) {
            return -parsed;
        }
        ++par_times;

        parsed += 2;
        id += 2;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    /* 1*(".." *WSP "/" *WSP) *(node-identifier *WSP "/" *WSP) node-identifier
     *
     * first parent reference with whitespaces already parsed
     */
    if (id[0] != '/') {
        return -parsed;
    }

    ++parsed;
    ++id;

    while (isspace(id[0])) {
        ++parsed;
        ++id;
    }

    while (!strncmp(id, "..", 2) && !*parent_times) {
        ++par_times;

        parsed += 2;
        id += 2;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        if (id[0] != '/') {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    if (!*parent_times) {
        *parent_times = par_times;
    }

    /* all parent references must be parsed at this point */
    if ((ret = parse_node_identifier(id, prefix, pref_len, name, nam_len)) < 1) {
        return -parsed+ret;
    }

    parsed += ret;
    id += ret;

    return parsed;
}